

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
pbrt::ParameterDictionary::
lookupArray<unsigned_char,pstd::vector<unsigned_char,pstd::pmr::polymorphic_allocator<unsigned_char>>const&(*)(pbrt::ParsedParameter_const&),bool(*)(unsigned_char_const*,pbrt::FileLoc_const*)>
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ParameterDictionary *this,string *name,ParameterType type,char *typeName,int nPerItem,
          _func_vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>_ptr_ParsedParameter_ptr
          *getValues,_func_bool_uchar_ptr_FileLoc_ptr *convert)

{
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar1;
  size_t sVar2;
  ParsedParameter *pPVar3;
  size_t __n;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  bool bVar6;
  int iVar7;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *pvVar8;
  anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
  *paVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  allocator_type local_55;
  int local_54;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_50;
  char *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  int local_34;
  
  paVar1 = (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
            *)(this->params).ptr;
  sVar2 = (this->params).nStored;
  paVar9 = &(this->params).field_2;
  if (paVar1 != (anon_union_64_1_a7e8d694_for_InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>_5
                 *)0x0) {
    paVar9 = paVar1;
  }
  bVar13 = sVar2 == 0;
  local_50 = __return_storage_ptr__;
  if (!bVar13) {
    lVar12 = 0;
    local_48 = typeName;
    local_34 = nPerItem;
    do {
      pPVar3 = *(ParsedParameter **)((long)paVar9 + lVar12);
      __n = (pPVar3->name)._M_string_length;
      if ((__n == name->_M_string_length) &&
         (((local_40 = &pPVar3->name, __n == 0 ||
           (iVar7 = bcmp((local_40->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n), iVar7 == 0)) &&
          (iVar7 = std::__cxx11::string::compare((char *)pPVar3), iVar7 == 0)))) {
        pvVar8 = (*getValues)(pPVar3);
        pvVar5 = local_50;
        local_54 = local_34;
        uVar4 = pvVar8->nStored;
        if (uVar4 == 0) {
          ErrorExit<std::__cxx11::string_const&>
                    (&pPVar3->loc,"No values provided for \"%s\".",local_40);
        }
        uVar10 = (ulong)local_34;
        local_48 = (char *)uVar4;
        if (uVar4 % uVar10 != 0) {
          ErrorExit<std::__cxx11::string_const&,int&>
                    (&pPVar3->loc,"Number of values provided for \"%s\" not a multiple of %d",
                     local_40,&local_54);
        }
        pPVar3->lookedUp = true;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (local_50,uVar4 / uVar10,&local_55);
        if (uVar10 <= local_48) {
          uVar11 = 0;
          do {
            bVar6 = (*convert)(pvVar8->ptr + (long)local_54 * uVar11,&pPVar3->loc);
            (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar11] = bVar6;
            uVar11 = uVar11 + 1;
          } while (uVar11 < uVar4 / uVar10);
        }
        if (!bVar13) {
          return local_50;
        }
        break;
      }
      lVar12 = lVar12 + 8;
      bVar13 = sVar2 << 3 == lVar12;
    } while (!bVar13);
  }
  (local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return local_50;
}

Assistant:

std::vector<ReturnType> ParameterDictionary::lookupArray(const std::string &name,
                                                         ParameterType type,
                                                         const char *typeName,
                                                         int nPerItem, G getValues,
                                                         C convert) const {
    for (const ParsedParameter *p : params)
        if (p->name == name && p->type == typeName)
            return returnArray<ReturnType>(getValues(*p), *p, nPerItem, convert);

    return {};
}